

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O0

void stable_grail_merge_without_buffer(int **arr,int len1,int len2)

{
  int iVar1;
  int in_EDX;
  int in_ESI;
  int **in_RDI;
  int h;
  uint3 uVar2;
  uint in_stack_ffffffffffffffe8;
  uint uVar3;
  int **local_8;
  
  local_8 = in_RDI;
  if (in_ESI < in_EDX) {
    while (in_ESI != 0) {
      iVar1 = stable_grail_bin_search_left(local_8 + in_ESI,in_EDX,local_8);
      uVar3 = in_stack_ffffffffffffffe8;
      if (iVar1 != 0) {
        stable_grail_rotate((int **)CONCAT44(in_ESI,in_EDX),iVar1,in_stack_ffffffffffffffe8);
        local_8 = local_8 + iVar1;
        in_EDX = in_EDX - iVar1;
        uVar3 = in_stack_ffffffffffffffe8;
      }
      if (in_EDX == 0) {
        return;
      }
      do {
        local_8 = local_8 + 1;
        in_ESI = in_ESI + -1;
        in_stack_ffffffffffffffe8 = uVar3 & 0xffffff;
        if (in_ESI != 0) {
          in_stack_ffffffffffffffe8 = CONCAT13(**local_8 - *local_8[in_ESI] < 1,(int3)uVar3);
        }
        uVar3 = in_stack_ffffffffffffffe8;
      } while ((char)(in_stack_ffffffffffffffe8 >> 0x18) != '\0');
    }
  }
  else {
    while (in_EDX != 0) {
      iVar1 = stable_grail_bin_search_right(in_RDI,in_ESI,in_RDI + (in_ESI + in_EDX + -1));
      if (iVar1 != in_ESI) {
        stable_grail_rotate((int **)CONCAT44(in_ESI,in_EDX),iVar1,in_stack_ffffffffffffffe8);
        in_ESI = iVar1;
      }
      if (in_ESI == 0) {
        return;
      }
      do {
        in_EDX = in_EDX + -1;
        uVar2 = (uint3)(ushort)in_stack_ffffffffffffffe8;
        if (in_EDX != 0) {
          uVar2 = CONCAT12(*in_RDI[(long)in_ESI + -1] - *in_RDI[(long)in_ESI + (long)in_EDX + -1] <
                           1,(ushort)in_stack_ffffffffffffffe8);
        }
        in_stack_ffffffffffffffe8 = CONCAT13((char)(in_stack_ffffffffffffffe8 >> 0x18),uVar2);
      } while ((char)(uVar2 >> 0x10) != '\0');
    }
  }
  return;
}

Assistant:

static void GRAIL_MERGE_WITHOUT_BUFFER(SORT_TYPE *arr, int len1, int len2) {
  int h;

  if (len1 < len2) {
    while (len1) {
      h = GRAIL_BIN_SEARCH_LEFT(arr + len1, len2, arr);

      if (h != 0) {
        GRAIL_ROTATE(arr, len1, h);
        arr += h;
        len2 -= h;
      }

      if (len2 == 0) {
        break;
      }

      do {
        arr++;
        len1--;
      } while (len1 && SORT_CMP_A(arr, arr + len1) <= 0);
    }
  } else {
    while (len2) {
      h = GRAIL_BIN_SEARCH_RIGHT(arr, len1, arr + (len1 + len2 - 1));

      if (h != len1) {
        GRAIL_ROTATE(arr + h, len1 - h, len2);
        len1 = h;
      }

      if (len1 == 0) {
        break;
      }

      do {
        len2--;
      } while (len2 && SORT_CMP_A(arr + len1 - 1, arr + len1 + len2 - 1) <= 0);
    }
  }
}